

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<double,double,duckdb::ArgMinMaxState<double,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<double,_double> *state,double *x,double *y,
               AggregateBinaryInput *binary)

{
  double dVar1;
  bool bVar2;
  double local_10;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    state->arg = *x;
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  else {
    dVar1 = *x;
    local_10 = *y;
    bVar2 = duckdb::GreaterThan::Operation<double>(&state->value,&local_10);
    if (bVar2) {
      state->arg = dVar1;
      state->value = local_10;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}